

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O2

void __thiscall
HighsCliqueTable::addClique
          (HighsCliqueTable *this,HighsMipSolver *mipsolver,CliqueVar *cliquevars,
          HighsInt numcliquevars,bool equality,HighsInt origin)

{
  double *pdVar1;
  double dVar2;
  CliqueVar CVar3;
  HighsMipSolverData *pHVar4;
  pointer piVar5;
  HighsMipSolverData *pHVar6;
  _Base_ptr p_Var7;
  long lVar8;
  long lVar9;
  byte bVar10;
  CliqueVar *pCVar11;
  bool bVar12;
  const_iterator cVar13;
  const_iterator __x;
  const_iterator cVar14;
  const_iterator __x_00;
  _Rb_tree_const_iterator<std::pair<double,_long>_> _Var15;
  CliqueVar *pCVar16;
  long lVar17;
  HighsInt numcliquevars_00;
  long lVar18;
  CliqueVar *pCVar19;
  CliqueVar *pCVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  long lVar24;
  int iVar25;
  _Rb_tree<std::pair<double,_long>,_std::pair<double,_long>,_std::_Identity<std::pair<double,_long>_>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
  *this_00;
  long lVar26;
  undefined7 in_register_00000081;
  _Rb_tree<std::pair<double,_long>,_std::pair<double,_long>,_std::_Identity<std::pair<double,_long>_>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
  *this_01;
  ulong uVar27;
  HighsDomain *globaldom;
  bool bVar28;
  double dVar29;
  double dVar30;
  key_type local_68;
  HighsInt local_54;
  HighsMipSolver *local_50;
  HighsDomain *local_48;
  undefined4 local_3c;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000081,equality);
  pHVar4 = (mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  globaldom = &pHVar4->domain;
  pCVar20 = cliquevars;
  local_54 = origin;
  local_50 = mipsolver;
  for (uVar27 = 0; (uint)numcliquevars != uVar27; uVar27 = uVar27 + 1) {
    resolveSubstitution(this,pCVar20);
    uVar21 = (ulong)((uint)*pCVar20 & 0x7fffffff);
    dVar29 = *(double *)
              (*(long *)&(pHVar4->domain).col_lower_.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl + uVar21 * 8);
    if (dVar29 == *(double *)
                   (*(long *)&(pHVar4->domain).col_upper_.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl +
                   uVar21 * 8)) {
      dVar30 = (double)((uint)*pCVar20 >> 0x1f);
      if ((dVar29 == dVar30) && (!NAN(dVar29) && !NAN(dVar30))) {
        uVar21 = uVar27 + 1;
        while( true ) {
          bVar28 = uVar27 == 0;
          uVar27 = uVar27 - 1;
          if (bVar28) {
            while( true ) {
              pCVar20 = pCVar20 + 1;
              if (numcliquevars <= (int)uVar21) {
                processInfeasibleVertices(this,globaldom);
                return;
              }
              dVar29 = 1.0;
              if ((int)*pCVar20 < 0) {
                dVar29 = 0.0;
              }
              uVar23 = (uint)*pCVar20 & 0x7fffffff;
              dVar30 = *(double *)
                        (*(long *)&(pHVar4->domain).col_lower_.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl +
                        (ulong)uVar23 * 8);
              dVar2 = *(double *)
                       (*(long *)&(pHVar4->domain).col_upper_.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl +
                       (ulong)uVar23 * 8);
              HighsDomain::fixCol(globaldom,uVar23,dVar29,(Reason)0xfffffffe);
              if ((pHVar4->domain).infeasible_ != false) break;
              if ((dVar30 != dVar2) || (NAN(dVar30) || NAN(dVar2))) {
                this->nfixings = this->nfixings + 1;
                std::
                vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
                push_back(&this->infeasvertexstack,pCVar20);
              }
              uVar21 = (ulong)((int)uVar21 + 1);
            }
            return;
          }
          dVar29 = 1.0;
          if ((int)*cliquevars < 0) {
            dVar29 = 0.0;
          }
          uVar23 = (uint)*cliquevars & 0x7fffffff;
          dVar30 = *(double *)
                    (*(long *)&(pHVar4->domain).col_lower_.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl +
                    (ulong)uVar23 * 8);
          dVar2 = *(double *)
                   (*(long *)&(pHVar4->domain).col_upper_.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl +
                   (ulong)uVar23 * 8);
          HighsDomain::fixCol(globaldom,uVar23,dVar29,(Reason)0xfffffffe);
          if ((pHVar4->domain).infeasible_ != false) break;
          if ((dVar30 != dVar2) || (NAN(dVar30) || NAN(dVar2))) {
            this->nfixings = this->nfixings + 1;
            std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
            push_back(&this->infeasvertexstack,cliquevars);
          }
          cliquevars = cliquevars + 1;
        }
        return;
      }
    }
    pCVar20 = pCVar20 + 1;
  }
  if (numcliquevars < 0x65) {
    local_38 = &this->infeasvertexstack;
    iVar25 = 1;
    if (1 < numcliquevars) {
      iVar25 = numcliquevars;
    }
    bVar10 = 0;
    local_48 = globaldom;
    for (uVar27 = 0; uVar27 != iVar25 - 1; uVar27 = uVar27 + 1) {
      CVar3 = cliquevars[uVar27];
      dVar29 = *(double *)
                (*(long *)&(pHVar4->domain).col_lower_.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl +
                (ulong)((uint)CVar3 & 0x7fffffff) * 8);
      pdVar1 = (double *)
               (*(long *)&(pHVar4->domain).col_upper_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl +
               (ulong)((uint)CVar3 & 0x7fffffff) * 8);
      if ((dVar29 != *pdVar1) || (NAN(dVar29) || NAN(*pdVar1))) {
        piVar5 = (this->numcliquesvar).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar21 = uVar27;
        if ((piVar5[(int)((int)CVar3 << 1 | (uint)((int)CVar3 < 0))] == 0) &&
           (piVar5[(int)((int)CVar3 << 1 | (uint)((int)((int)CVar3 + 0x80000000U) < 0))] == 0)) {
          bVar10 = 1;
        }
        else {
          while (uVar21 = uVar21 + 1, (int)uVar21 < numcliquevars) {
            uVar22 = (ulong)((uint)cliquevars[uVar21] & 0x7fffffff);
            dVar29 = *(double *)
                      (*(long *)&(pHVar4->domain).col_lower_.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl +
                      uVar22 * 8);
            pdVar1 = (double *)
                     (*(long *)&(pHVar4->domain).col_upper_.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl +
                     uVar22 * 8);
            if (((dVar29 != *pdVar1) || (NAN(dVar29) || NAN(*pdVar1))) &&
               (bVar28 = haveCommonClique(this,cliquevars[uVar27],cliquevars[uVar21]), !bVar28)) {
              bVar28 = processNewEdge(this,local_48,cliquevars[uVar27],cliquevars[uVar21]);
              if ((pHVar4->domain).infeasible_ != false) {
                return;
              }
              bVar12 = HighsNodeQueue::empty
                                 (&((local_50->mipdata_)._M_t.
                                    super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                    .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl
                                   )->nodequeue);
              if (!bVar12) {
                CVar3 = cliquevars[uVar27];
                pHVar6 = (local_50->mipdata_)._M_t.
                         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                         .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
                lVar24 = *(long *)((long)&(pHVar6->nodequeue).colLowerNodesPtr +
                                  (ulong)(~(uint)CVar3 >> 0x1f) * 8);
                lVar18 = ((ulong)(uint)CVar3 & 0x7fffffff) * 0x38;
                if ((*(long *)(lVar24 + 0x30 + lVar18) != 0) &&
                   (this_01 = (_Rb_tree<std::pair<double,_long>,_std::pair<double,_long>,_std::_Identity<std::pair<double,_long>_>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
                               *)(((ulong)(uint)cliquevars[uVar21] & 0x7fffffff) * 0x38 +
                                 *(long *)((long)&(pHVar6->nodequeue).colLowerNodesPtr +
                                          (ulong)(~(uint)cliquevars[uVar21] >> 0x1f) * 8)),
                   (this_01->_M_impl).super__Rb_tree_header._M_node_count != 0)) {
                  this_00 = (_Rb_tree<std::pair<double,_long>,_std::pair<double,_long>,_std::_Identity<std::pair<double,_long>_>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
                             *)(lVar24 + lVar18);
                  local_68.first = (double)((uint)CVar3 >> 0x1f);
                  local_68.second = 0x7fffffff;
                  cVar13 = std::
                           _Rb_tree<std::pair<double,_long>,_std::pair<double,_long>,_std::_Identity<std::pair<double,_long>_>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
                           ::lower_bound(this_00,&local_68);
                  local_68.first = (double)((uint)cliquevars[uVar27] >> 0x1f);
                  local_68.second = 0x7fffffff;
                  __x = std::
                        _Rb_tree<std::pair<double,_long>,_std::pair<double,_long>,_std::_Identity<std::pair<double,_long>_>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
                        ::upper_bound(this_00,&local_68);
                  local_68.first = (double)((uint)cliquevars[uVar21] >> 0x1f);
                  local_68.second = 0x7fffffff;
                  cVar14 = std::
                           _Rb_tree<std::pair<double,_long>,_std::pair<double,_long>,_std::_Identity<std::pair<double,_long>_>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
                           ::lower_bound(this_01,&local_68);
                  local_68.first = (double)((uint)cliquevars[uVar21] >> 0x1f);
                  local_68.second = 0x7fffffff;
                  __x_00 = std::
                           _Rb_tree<std::pair<double,_long>,_std::pair<double,_long>,_std::_Identity<std::pair<double,_long>_>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
                           ::upper_bound(this_01,&local_68);
                  if (((cVar13._M_node != __x._M_node) && (cVar14._M_node != __x_00._M_node)) &&
                     ((p_Var7 = cVar13._M_node[1]._M_parent,
                      _Var15 = std::prev<std::_Rb_tree_const_iterator<std::pair<double,long>>>
                                         (__x_00._M_node,1),
                      (long)p_Var7 <= (long)_Var15._M_node[1]._M_parent ||
                      (p_Var7 = cVar14._M_node[1]._M_parent,
                      _Var15 = std::prev<std::_Rb_tree_const_iterator<std::pair<double,long>>>
                                         (__x._M_node,1),
                      (long)p_Var7 <= (long)_Var15._M_node[1]._M_parent)))) {
                    while ((cVar13._M_node != __x._M_node && (cVar14._M_node != __x_00._M_node))) {
                      p_Var7 = cVar14._M_node[1]._M_parent;
                      if ((long)cVar13._M_node[1]._M_parent < (long)p_Var7) {
                        cVar13._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar13._M_node);
                      }
                      else if ((long)p_Var7 < (long)cVar13._M_node[1]._M_parent) {
                        cVar14._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar14._M_node);
                      }
                      else {
                        cVar13._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar13._M_node);
                        cVar14._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar14._M_node);
                        dVar29 = HighsNodeQueue::pruneNode
                                           (&((local_50->mipdata_)._M_t.
                                              super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                              .super__Head_base<0UL,_HighsMipSolverData_*,_false>.
                                             _M_head_impl)->nodequeue,(long)(int)p_Var7);
                        HighsCDouble::operator+=
                                  (&((local_50->mipdata_)._M_t.
                                     super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                     .super__Head_base<0UL,_HighsMipSolverData_*,_false>.
                                    _M_head_impl)->pruned_treeweight,dVar29);
                      }
                    }
                  }
                }
              }
              globaldom = local_48;
              bVar10 = 1;
              if (bVar28) {
                for (uVar22 = 0; (uint)numcliquevars != uVar22; uVar22 = uVar22 + 1) {
                  if ((uVar27 != uVar22) && ((uVar21 & 0xffffffff) != uVar22)) {
                    dVar29 = 1.0;
                    if ((int)*cliquevars < 0) {
                      dVar29 = 0.0;
                    }
                    uVar23 = (uint)*cliquevars & 0x7fffffff;
                    dVar30 = *(double *)
                              (*(long *)&(pHVar4->domain).col_lower_.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                              + (ulong)uVar23 * 8);
                    dVar2 = *(double *)
                             (*(long *)&(pHVar4->domain).col_upper_.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl
                             + (ulong)uVar23 * 8);
                    HighsDomain::fixCol(globaldom,uVar23,dVar29,(Reason)0xfffffffe);
                    if ((pHVar4->domain).infeasible_ != false) {
                      return;
                    }
                    if ((dVar30 != dVar2) || (NAN(dVar30) || NAN(dVar2))) {
                      this->nfixings = this->nfixings + 1;
                      std::
                      vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ::push_back(local_38,cliquevars);
                    }
                  }
                  cliquevars = cliquevars + 1;
                }
                goto LAB_00276c9e;
              }
            }
          }
        }
      }
    }
    globaldom = local_48;
    if ((bool)(local_54 == 0x7fffffff & (bVar10 ^ 1))) {
      return;
    }
  }
  lVar18 = (long)numcliquevars;
  pCVar20 = cliquevars + lVar18;
  lVar24 = 0xc;
  lVar17 = 0;
  for (lVar26 = lVar18 >> 2; pCVar19 = pCVar20, 0 < lVar26; lVar26 = lVar26 + -1) {
    uVar27 = (ulong)(*(uint *)(&cliquevars[-3].field_0x0 + lVar24) & 0x7fffffff);
    lVar8 = *(long *)&(pHVar4->domain).col_lower_.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl;
    lVar9 = *(long *)&(pHVar4->domain).col_upper_.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl;
    dVar29 = *(double *)(lVar8 + uVar27 * 8);
    pdVar1 = (double *)(lVar9 + uVar27 * 8);
    if ((dVar29 == *pdVar1) && (!NAN(dVar29) && !NAN(*pdVar1))) {
      pCVar16 = (CliqueVar *)((long)cliquevars - lVar17);
      goto LAB_00276c29;
    }
    uVar27 = (ulong)(*(uint *)(&cliquevars[-2].field_0x0 + lVar24) & 0x7fffffff);
    dVar29 = *(double *)(lVar8 + uVar27 * 8);
    pdVar1 = (double *)(lVar9 + uVar27 * 8);
    if ((dVar29 == *pdVar1) && (!NAN(dVar29) && !NAN(*pdVar1))) {
      pCVar16 = (CliqueVar *)((long)cliquevars + (4 - lVar17));
      goto LAB_00276c29;
    }
    uVar27 = (ulong)(*(uint *)(&cliquevars[-1].field_0x0 + lVar24) & 0x7fffffff);
    dVar29 = *(double *)(lVar8 + uVar27 * 8);
    pdVar1 = (double *)(lVar9 + uVar27 * 8);
    if ((dVar29 == *pdVar1) && (!NAN(dVar29) && !NAN(*pdVar1))) {
      pCVar16 = (CliqueVar *)((long)cliquevars + (8 - lVar17));
      goto LAB_00276c29;
    }
    uVar27 = (ulong)(*(uint *)(&cliquevars->field_0x0 + lVar24) & 0x7fffffff);
    dVar29 = *(double *)(lVar8 + uVar27 * 8);
    pdVar1 = (double *)(lVar9 + uVar27 * 8);
    if ((dVar29 == *pdVar1) && (!NAN(dVar29) && !NAN(*pdVar1))) {
      pCVar16 = (CliqueVar *)((long)cliquevars + (0xc - lVar17));
      goto LAB_00276c29;
    }
    lVar17 = lVar17 + -0x10;
    lVar24 = lVar24 + 0x10;
  }
  lVar18 = lVar17 + lVar18 * 4 >> 2;
  pCVar16 = (CliqueVar *)((long)cliquevars - lVar17);
  if (lVar18 == 3) {
    uVar27 = (ulong)(*(uint *)(&cliquevars[-3].field_0x0 + lVar24) & 0x7fffffff);
    lVar24 = *(long *)&(pHVar4->domain).col_lower_.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl;
    lVar18 = *(long *)&(pHVar4->domain).col_upper_.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl;
    dVar29 = *(double *)(lVar24 + uVar27 * 8);
    pdVar1 = (double *)(lVar18 + uVar27 * 8);
    if ((dVar29 != *pdVar1) || (NAN(dVar29) || NAN(*pdVar1))) {
      pCVar16 = (CliqueVar *)((long)cliquevars + (4 - lVar17));
      goto LAB_00276bf9;
    }
  }
  else {
    if (lVar18 == 2) {
      lVar24 = *(long *)&(pHVar4->domain).col_lower_.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl;
      lVar18 = *(long *)&(pHVar4->domain).col_upper_.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl;
LAB_00276bf9:
      dVar29 = *(double *)(lVar24 + (ulong)((uint)*pCVar16 & 0x7fffffff) * 8);
      pdVar1 = (double *)(lVar18 + (ulong)((uint)*pCVar16 & 0x7fffffff) * 8);
      if ((dVar29 == *pdVar1) && (!NAN(dVar29) && !NAN(*pdVar1))) goto LAB_00276c29;
      pCVar16 = pCVar16 + 1;
    }
    else {
      if (lVar18 != 1) goto LAB_00276c75;
      lVar24 = *(long *)&(pHVar4->domain).col_lower_.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl;
      lVar18 = *(long *)&(pHVar4->domain).col_upper_.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl;
    }
    dVar29 = *(double *)(lVar24 + (ulong)((uint)*pCVar16 & 0x7fffffff) * 8);
    pdVar1 = (double *)(lVar18 + (ulong)((uint)*pCVar16 & 0x7fffffff) * 8);
    if ((dVar29 != *pdVar1) || (NAN(dVar29) || NAN(*pdVar1))) goto LAB_00276c75;
  }
LAB_00276c29:
  pCVar11 = pCVar16;
  if (pCVar16 != pCVar20) {
    while (pCVar19 = pCVar11, pCVar16 = pCVar16 + 1, pCVar16 != pCVar20) {
      uVar27 = (ulong)((uint)*pCVar16 & 0x7fffffff);
      dVar29 = *(double *)
                (*(long *)&(pHVar4->domain).col_lower_.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl + uVar27 * 8)
      ;
      pdVar1 = (double *)
               (*(long *)&(pHVar4->domain).col_upper_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl + uVar27 * 8);
      if ((dVar29 != *pdVar1) || (pCVar11 = pCVar19, NAN(dVar29) || NAN(*pdVar1))) {
        *pCVar19 = *pCVar16;
        pCVar11 = pCVar19 + 1;
      }
    }
  }
LAB_00276c75:
  numcliquevars_00 = (HighsInt)((ulong)((long)pCVar19 - (long)cliquevars) >> 2);
  if (1 < numcliquevars_00) {
    doAddClique(this,cliquevars,numcliquevars_00,local_3c._0_1_,local_54);
LAB_00276c9e:
    processInfeasibleVertices(this,globaldom);
  }
  return;
}

Assistant:

void HighsCliqueTable::addClique(const HighsMipSolver& mipsolver,
                                 CliqueVar* cliquevars, HighsInt numcliquevars,
                                 bool equality, HighsInt origin) {
  HighsDomain& globaldom = mipsolver.mipdata_->domain;
  mipsolver.mipdata_->debugSolution.checkClique(cliquevars, numcliquevars);
  for (HighsInt i = 0; i != numcliquevars; ++i) {
    resolveSubstitution(cliquevars[i]);
    if (globaldom.isFixed(cliquevars[i].col)) {
      if (cliquevars[i].val == globaldom.col_lower_[cliquevars[i].col]) {
        // column is fixed to 1, every other entry can be fixed to zero
        HighsInt k;
        for (k = 0; k < i; ++k) {
          bool wasfixed = globaldom.isFixed(cliquevars[k].col);
          globaldom.fixCol(cliquevars[k].col, double(1 - cliquevars[k].val));
          if (globaldom.infeasible()) return;
          if (!wasfixed) {
            ++nfixings;
            infeasvertexstack.push_back(cliquevars[k]);
          }
        }
        for (k = i + 1; k < numcliquevars; ++k) {
          bool wasfixed = globaldom.isFixed(cliquevars[k].col);
          globaldom.fixCol(cliquevars[k].col, double(1 - cliquevars[k].val));
          if (globaldom.infeasible()) return;
          if (!wasfixed) {
            ++nfixings;
            infeasvertexstack.push_back(cliquevars[k]);
          }
        }

        processInfeasibleVertices(globaldom);
        return;
      }
    }
  }

  if (numcliquevars <= 100) {
    bool hasNewEdge = false;

    // todo, sort new clique to allow log n lookup of membership in size by
    // binary search

    for (HighsInt i = 0; i < numcliquevars - 1; ++i) {
      if (globaldom.isFixed(cliquevars[i].col)) continue;
      if (numCliques(cliquevars[i]) == 0 &&
          numCliques(cliquevars[i].complement()) == 0) {
        hasNewEdge = true;
        continue;
      }

      for (HighsInt j = i + 1; j < numcliquevars; ++j) {
        if (globaldom.isFixed(cliquevars[j].col)) continue;

        if (haveCommonClique(cliquevars[i], cliquevars[j])) continue;
        // todo: Instead of haveCommonClique use findCommonClique. If the common
        // clique is smaller than this clique check if it is a subset of this
        // clique. If it is a subset remove the clique and iterate the process
        // until either a common clique that is not a subset of this one is
        // found, or no common clique exists anymore in which case we proceed
        // with the code below and set hasNewEdge to true

        hasNewEdge = true;

        bool iscover = processNewEdge(globaldom, cliquevars[i], cliquevars[j]);
        if (globaldom.infeasible()) return;

        if (!mipsolver.mipdata_->nodequeue.empty()) {
          const auto& v1Nodes =
              cliquevars[i].val == 1
                  ? mipsolver.mipdata_->nodequeue.getUpNodes(cliquevars[i].col)
                  : mipsolver.mipdata_->nodequeue.getDownNodes(
                        cliquevars[i].col);
          const auto& v2Nodes =
              cliquevars[j].val == 1
                  ? mipsolver.mipdata_->nodequeue.getUpNodes(cliquevars[j].col)
                  : mipsolver.mipdata_->nodequeue.getDownNodes(
                        cliquevars[j].col);

          if (!v1Nodes.empty() && !v2Nodes.empty()) {
            // general integer variables can become binary during the search
            // and the cliques might be discovered. That means we need to take
            // care here, since the set of nodes branched upwards or downwards
            // are not necessarily containing domain changes setting the
            // variables to the corresponding clique value but could be
            // redundant bound changes setting the upper bound to u >= 1 or the
            // lower bound to l <= 0.

            // itV1 will point to the first node where v1 is fixed to val and
            // endV1 to the end of the range of such nodes. Same for itV2/endV2
            // with v2.
            auto itV1 = v1Nodes.lower_bound(
                std::make_pair(double(cliquevars[i].val), kHighsIInf));
            auto endV1 = v1Nodes.upper_bound(
                std::make_pair(double(cliquevars[i].val), kHighsIInf));
            auto itV2 = v2Nodes.lower_bound(
                std::make_pair(double(cliquevars[j].val), kHighsIInf));
            auto endV2 = v2Nodes.upper_bound(
                std::make_pair(double(cliquevars[j].val), kHighsIInf));

            if (itV1 != endV1 && itV2 != endV2 &&
                (itV1->second <= std::prev(endV2)->second ||
                 itV2->second <= std::prev(endV1)->second)) {
              // node ranges overlap, check for nodes that can be pruned
              while (itV1 != endV1 && itV2 != endV2) {
                if (itV1->second < itV2->second) {
                  ++itV1;
                } else if (itV2->second < itV1->second) {
                  ++itV2;
                } else {
                  // if (!mipsolver.submip)
                  //   printf("node %d can be pruned\n", itV2->second);
                  HighsInt prunedNode = itV2->second;
                  ++itV1;
                  ++itV2;
                  mipsolver.mipdata_->pruned_treeweight +=
                      mipsolver.mipdata_->nodequeue.pruneNode(prunedNode);
                }
              }
            }
          }
        }

        if (iscover) {
          for (HighsInt k = 0; k != numcliquevars; ++k) {
            if (k == i || k == j) continue;

            bool wasfixed = globaldom.isFixed(cliquevars[k].col);
            globaldom.fixCol(cliquevars[k].col, double(1 - cliquevars[k].val));
            if (globaldom.infeasible()) return;
            if (!wasfixed) {
              ++nfixings;
              infeasvertexstack.push_back(cliquevars[k]);
            }
          }

          processInfeasibleVertices(globaldom);
          return;
        }
      }
    }
    if (!hasNewEdge && origin == kHighsIInf) return;
  }
  CliqueVar* unfixedend =
      std::remove_if(cliquevars, cliquevars + numcliquevars,
                     [&](CliqueVar v) { return globaldom.isFixed(v.col); });
  numcliquevars = unfixedend - cliquevars;
  if (numcliquevars < 2) return;

  doAddClique(cliquevars, numcliquevars, equality, origin);
  processInfeasibleVertices(globaldom);
}